

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_lower(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  size_t local_440;
  luaL_Buffer local_438;
  
  pcVar2 = luaL_checklstring(L,1,&local_440);
  pcVar3 = luaL_buffinitsize(L,&local_438,local_440);
  if (local_440 != 0) {
    uVar4 = 0;
    do {
      iVar1 = tolower((uint)(byte)pcVar2[uVar4]);
      pcVar3[uVar4] = (char)iVar1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_440);
  }
  luaL_pushresultsize(&local_438,local_440);
  return 1;
}

Assistant:

static int str_lower (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i=0; i<l; i++)
    p[i] = tolower(uchar(s[i]));
  luaL_pushresultsize(&b, l);
  return 1;
}